

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric::SetMainInertiasInMassReference
          (ChBeamSectionTimoshenkoAdvancedGeneric *this,double Jmyy,double Jmzz,double Jmyz,
          double mass_phi,double Qmy,double Qmz)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  EigenMat5x1 Jm_vec;
  undefined1 extraout_var [56];
  
  auVar5._0_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).
                 super_ChBeamSectionEulerAdvancedGeneric.My;
  auVar5._8_8_ = (this->super_ChBeamSectionRayleighAdvancedGeneric).
                 super_ChBeamSectionEulerAdvancedGeneric.Mz;
  auVar16 = vpermilpd_avx(auVar5,1);
  dVar1 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .mu;
  auVar6._8_8_ = dVar1;
  auVar6._0_8_ = dVar1;
  auVar9 = vmulpd_avx512vl(auVar16,auVar6);
  auVar5 = vshufpd_avx(auVar9,auVar9,1);
  dVar1 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .Mz;
  dVar13 = cos(mass_phi);
  dVar14 = sin(mass_phi);
  dVar15 = cos(mass_phi + mass_phi);
  auVar17._0_8_ = sin(mass_phi + mass_phi);
  auVar17._8_56_ = extraout_var;
  dVar2 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .My;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar2;
  dVar3 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .Mz;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar3;
  auVar7._8_8_ = extraout_XMM0_Qb_00;
  auVar7._0_8_ = dVar14;
  auVar8._8_8_ = extraout_XMM0_Qb;
  auVar8._0_8_ = dVar13;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = Qmy;
  auVar10 = vmovddup_avx512vl(auVar4);
  auVar30._8_8_ = Jmzz;
  auVar30._0_8_ = Jmzz;
  auVar31._8_8_ = Jmyz;
  auVar31._0_8_ = Jmyz;
  auVar29 = ZEXT816(0) << 0x40;
  auVar20._0_8_ = -dVar14;
  auVar20._8_8_ = extraout_XMM0_Qb_00 ^ 0x8000000000000000;
  auVar6 = vunpcklpd_avx(auVar7,auVar8);
  auVar19._0_8_ = -auVar17._0_8_;
  auVar19._8_8_ = extraout_var._0_8_ ^ 0x8000000000000000;
  auVar4 = vunpcklpd_avx(auVar8,auVar20);
  auVar18._0_8_ = auVar6._0_8_ * auVar6._0_8_;
  auVar18._8_8_ = auVar6._8_8_ * auVar6._8_8_;
  auVar7 = vunpcklpd_avx(auVar17._0_16_,auVar19);
  auVar11 = vmulpd_avx512vl(auVar4,auVar10);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar13 * (dVar3 + dVar3);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar14 * dVar2 * -2.0;
  auVar4 = vunpcklpd_avx(auVar24,auVar25);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar14 * dVar3;
  auVar19 = vfmsub231sd_fma(auVar27,auVar21,auVar8);
  auVar28._8_8_ = Qmz;
  auVar28._0_8_ = Qmz;
  auVar12 = vmulpd_avx512vl(auVar10,auVar4);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar14 * dVar2;
  auVar10 = vfmadd231sd_fma(auVar10,auVar22,auVar8);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar14 * (dVar3 + dVar3);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar13 * (dVar2 + dVar2);
  auVar8 = vunpcklpd_avx(auVar23,auVar26);
  auVar4 = vshufpd_avx(auVar18,auVar18,1);
  auVar6 = vfmadd231pd_fma(auVar11,auVar28,auVar6);
  auVar11._8_8_ = Jmyy;
  auVar11._0_8_ = Jmyy;
  auVar8 = vfmadd231pd_fma(auVar12,auVar28,auVar8);
  auVar4 = vfmadd231pd_fma(auVar8,auVar11,auVar4);
  auVar6 = vfmadd231pd_fma(auVar6,auVar11,auVar29);
  auVar4 = vfmadd231pd_fma(auVar4,auVar18,auVar30);
  auVar6 = vfmadd231pd_fma(auVar6,auVar30,auVar29);
  auVar4 = vfmadd231pd_fma(auVar4,auVar31,auVar7);
  auVar12._0_8_ = auVar4._0_8_ + auVar16._0_8_ * auVar9._0_8_;
  auVar12._8_8_ = auVar4._8_8_ + auVar16._8_8_ * auVar9._8_8_;
  auVar6 = vfmadd231pd_fma(auVar6,auVar31,auVar29);
  auVar4 = vshufpd_avx(auVar12,auVar12,1);
  this->Qy = auVar6._0_8_ + auVar9._0_8_;
  this->Qz = auVar6._8_8_ + auVar9._8_8_;
  (this->super_ChBeamSectionRayleighAdvancedGeneric).Jzz = (double)auVar4._0_8_;
  (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyy = (double)auVar4._8_8_;
  (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyz =
       auVar19._0_8_ * Qmy + auVar10._0_8_ * Qmz +
       auVar17._0_8_ * -0.5 * Jmyy + auVar17._0_8_ * 0.5 * Jmzz + Jmyz * dVar15 +
       auVar5._0_8_ * dVar1;
  auVar16._0_8_ = auVar12._0_8_ + auVar12._8_8_;
  auVar16._8_8_ = auVar12._0_8_ + auVar12._8_8_;
  dVar1 = (double)vmovlpd_avx(auVar16);
  (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.Jxx =
       dVar1;
  return;
}

Assistant:

void ChBeamSectionTimoshenkoAdvancedGeneric::SetMainInertiasInMassReference(const double Jmyy,
                                                                            const double Jmzz,
                                                                            const double Jmyz,
                                                                            const double mass_phi,
                                                                            const double Qmy,
                                                                            const double Qmz) {
    // define a vector of local mass properties expressed in mass center coordinate system
    EigenMat5x1 Jm_vec;
    // Jm_vec << Qmy, Qmz, Jmyy, Jmzz, Jmyz;
    Jm_vec(0) = Qmy;
    Jm_vec(1) = Qmz;
    Jm_vec(2) = Jmyy;
    Jm_vec(3) = Jmzz;
    Jm_vec(4) = Jmyz;

    // A constant vector, which is from the mass center offset (My,Mz)
    EigenMat5x1 const_vec;
    const_vec.setZero();
    const_vec(0) = this->mu * this->Mz;
    const_vec(1) = this->mu * this->My;
    const_vec(2) = this->mu * this->Mz * this->Mz;
    const_vec(3) = this->mu * this->My * this->My;
    const_vec(4) = this->mu * this->My * this->Mz;

    // Transformation matrix from the mass center coordinate system to the centerline of beam
    EigenMat5x5 Acog2cl;
    Acog2cl.setZero();
    double cosphi = cos(mass_phi);
    double sinphi = sin(mass_phi);
    double cos2phi = cos(2. * mass_phi);
    double sin2phi = sin(2. * mass_phi);
    double cosphi2 = cosphi * cosphi;
    double sinphi2 = sinphi * sinphi;

    Acog2cl(0, 0) = cosphi;
    Acog2cl(0, 1) = sinphi;

    Acog2cl(1, 0) = -sinphi;
    Acog2cl(1, 1) = cosphi;

    Acog2cl(2, 0) = 2. * this->Mz * cosphi;
    Acog2cl(2, 1) = 2. * this->Mz * sinphi;
    Acog2cl(2, 2) = cosphi2;
    Acog2cl(2, 3) = sinphi2;
    Acog2cl(2, 4) = sin2phi;

    Acog2cl(3, 0) = -2. * this->My * sinphi;
    Acog2cl(3, 1) = 2. * this->My * cosphi;
    Acog2cl(3, 2) = sinphi2;
    Acog2cl(3, 3) = cosphi2;
    Acog2cl(3, 4) = -sin2phi;

    Acog2cl(4, 0) = this->My * cosphi - this->Mz * sinphi;
    Acog2cl(4, 1) = this->Mz * cosphi + this->My * sinphi;
    Acog2cl(4, 2) = -1. / 2. * sin2phi;
    Acog2cl(4, 3) = 1. / 2. * sin2phi;
    Acog2cl(4, 4) = cos2phi;

    EigenMat5x1 J_vec;
    J_vec.setZero();
    J_vec = const_vec + Acog2cl * Jm_vec;

    this->Qy = J_vec(0);
    this->Qz = J_vec(1);
    this->Jyy = J_vec(2);
    this->Jzz = J_vec(3);
    this->Jyz = J_vec(4);
    // Automatically set parent Jxx value
    this->Jxx = (this->Jyy + this->Jzz);
}